

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O0

void TestEq<int,unsigned_short>
               (int expval,unsigned_short val,char *exp,char *file,int line,char *func)

{
  type_conflict1 t;
  type_conflict4 t_00;
  char *expval_00;
  char *val_00;
  string local_70;
  string local_50;
  char *local_30;
  char *func_local;
  char *pcStack_20;
  int line_local;
  char *file_local;
  char *exp_local;
  unsigned_short val_local;
  int expval_local;
  
  if ((expval & 0xffffU) != (uint)val) {
    local_30 = func;
    func_local._4_4_ = line;
    pcStack_20 = file;
    file_local = exp;
    exp_local._2_2_ = val;
    exp_local._4_4_ = expval;
    t_00 = scalar_as_underlying<int>(expval);
    flatbuffers::NumToString<int>(&local_50,t_00);
    expval_00 = (char *)std::__cxx11::string::c_str();
    t = scalar_as_underlying<unsigned_short>(exp_local._2_2_);
    flatbuffers::NumToString<unsigned_short>(&local_70,t);
    val_00 = (char *)std::__cxx11::string::c_str();
    TestFail(expval_00,val_00,file_local,pcStack_20,func_local._4_4_,local_30);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line,
            const char *func) {
  if (static_cast<U>(expval) != val) {
    TestFail(flatbuffers::NumToString(scalar_as_underlying(expval)).c_str(),
             flatbuffers::NumToString(scalar_as_underlying(val)).c_str(), exp,
             file, line, func);
  }
}